

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

CHAR CNNModelPredictBinary0DQ(CharCNNClassifier *model,IplImage *pImage)

{
  INT32U IVar1;
  bool bVar2;
  CHAR CVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  INT32U IVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  long lVar16;
  bool bVar17;
  long lVar18;
  undefined8 uStack_90;
  int aiStack_88 [2];
  IplImage *local_80;
  long local_78;
  ulong local_70;
  long local_68;
  ulong local_60;
  long local_58;
  int local_4c;
  ulong local_48;
  CharCNNClassifier *local_40;
  ulong local_38;
  
  local_80 = pImage;
  IVar1 = (model->model_binary_0DQ).C11.outChannels;
  lVar8 = -0x88 - ((ulong)(IVar1 * 0xa9) * 4 + 0xf & 0xfffffffffffffff0);
  local_58 = (long)aiStack_88 +
             (lVar8 - ((ulong)(model->model_binary_0DQ).FC1.inputNum * 4 + 0xf & 0xfffffffffffffff0)
             ) + 0x88;
  uVar5 = (model->model_binary_0DQ).FC1.outputNum;
  lVar16 = local_58 - ((ulong)uVar5 * 4 + 0xf & 0xfffffffffffffff0);
  local_40 = model;
  lVar18 = lVar16;
  if (IVar1 != 0) {
    local_38 = 0;
    uVar6 = 0;
    local_68 = lVar16;
    do {
      local_4c = Binary0DQ_C11_B_Weight[uVar6];
      local_78 = (long)aiStack_88 + ((long)(uVar6 * 0xa900000000) >> 0x1e) + lVar8 + 0x88;
      uVar4 = 0;
      local_70 = uVar6;
      do {
        local_48 = uVar4 * 0x34 + local_78;
        lVar18 = 0;
        local_60 = uVar4;
        do {
          IVar1 = (local_40->model_binary_0DQ).C11.height;
          if (IVar1 == 0) {
            iVar10 = 0;
          }
          else {
            uVar5 = (local_40->model_binary_0DQ).C11.widthStep;
            IVar7 = 0;
            uVar4 = local_60 & 0xffffffff;
            iVar10 = 0;
            uVar6 = local_38;
            do {
              if ((ulong)uVar5 != 0) {
                iVar11 = local_80->widthStep * (int)uVar4 + (int)lVar18;
                uVar13 = uVar6 & 0xffffffff;
                uVar14 = (ulong)uVar5;
                do {
                  iVar10 = iVar10 + (uint)local_80->imageData[iVar11] *
                                    Binary0DQ_C11_Map_Weight[(int)uVar13];
                  iVar11 = iVar11 + 1;
                  uVar13 = (ulong)((int)uVar13 + 1);
                  uVar14 = uVar14 - 1;
                } while (uVar14 != 0);
              }
              IVar7 = IVar7 + 1;
              uVar4 = (ulong)((int)uVar4 + 1);
              uVar6 = (ulong)((int)uVar6 + uVar5);
            } while (IVar7 != IVar1);
          }
          iVar10 = iVar10 + local_4c;
          *(undefined8 *)(lVar16 + -8) = 0x10261a;
          iVar10 = TanhApproximateFunction(iVar10);
          *(int *)(local_48 + lVar18 * 4) = iVar10;
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0xd);
        uVar4 = local_60 + 1;
      } while (uVar4 != 0xd);
      uVar6 = local_70 + 1;
      uVar4 = (ulong)(local_40->model_binary_0DQ).C11.outChannels;
      local_38 = (ulong)((int)local_38 + 9);
    } while (uVar6 < uVar4);
    if (uVar4 != 0) {
      uVar6 = 0;
      local_48 = uVar4;
      do {
        lVar18 = 0;
        do {
          lVar12 = 0;
          do {
            iVar10 = -10;
            uVar5 = 0;
            bVar2 = true;
            do {
              bVar17 = bVar2;
              iVar11 = 0;
              bVar2 = true;
              do {
                bVar15 = bVar2;
                iVar11 = *(int *)((long)aiStack_88 +
                                 (long)(int)(iVar11 + (uVar5 | (int)lVar18 * 2) * 0xd +
                                                      (int)uVar6 * 0xa9 + (int)lVar12 * 2) * 4 +
                                 lVar8 + 0x88);
                if (iVar10 < iVar11) {
                  iVar10 = iVar11;
                }
                iVar11 = 1;
                bVar2 = false;
              } while (bVar15);
              uVar5 = 1;
              bVar2 = false;
            } while (bVar17);
            *(int *)(((long)((uVar6 << 0x22) * 9) >> 0x1e) + local_58 + lVar18 * 0x18 + lVar12 * 4)
                 = iVar10;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
          lVar18 = lVar18 + 1;
        } while (lVar18 != 6);
        uVar6 = uVar6 + 1;
      } while (uVar6 != local_48);
    }
    uVar5 = (local_40->model_binary_0DQ).FC1.outputNum;
    lVar18 = local_68;
  }
  lVar8 = local_58;
  if (uVar5 != 0) {
    uVar6 = 0;
    do {
      uVar5 = (local_40->model_binary_0DQ).FC1.inputNum;
      iVar10 = 0;
      if ((ulong)uVar5 != 0) {
        uVar4 = 0;
        iVar10 = 0;
        do {
          iVar10 = iVar10 + Binary0DQ_FC1_Map_Weight[uVar5 * (int)uVar6 + (int)uVar4] *
                            *(int *)(lVar8 + uVar4 * 4);
          uVar4 = uVar4 + 1;
        } while (uVar5 != uVar4);
      }
      iVar11 = Binary0DQ_FC1_B_Weight[uVar6];
      *(undefined8 *)(lVar16 + -8) = 0x10277a;
      iVar10 = TanhApproximateFunction(iVar10 + iVar11);
      *(int *)(lVar18 + uVar6 * 4) = iVar10;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (local_40->model_binary_0DQ).FC1.outputNum);
  }
  uVar6 = (ulong)(local_40->model_binary_0DQ).FC2.outputNum;
  if (uVar6 != 0) {
    uVar14 = (ulong)(local_40->model_binary_0DQ).FC2.inputNum;
    lVar8 = 0;
    iVar10 = -10000;
    uVar13 = 0;
    uVar4 = 0;
    do {
      iVar11 = 0;
      if (uVar14 != 0) {
        uVar9 = 0;
        iVar11 = 0;
        do {
          iVar11 = iVar11 + Binary0DQ_FC2_Map_Weight[(uint)((int)lVar8 + (int)uVar9)] *
                            *(int *)(lVar18 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while (uVar14 != uVar9);
      }
      if (iVar10 < iVar11 + Binary0DQ_FC2_B_Weight[uVar13]) {
        uVar4 = uVar13 & 0xffffffff;
        iVar10 = iVar11 + Binary0DQ_FC2_B_Weight[uVar13];
      }
      uVar13 = uVar13 + 1;
      lVar8 = lVar8 + uVar14;
    } while (uVar13 != uVar6);
    CVar3 = '\x19';
    if ((int)uVar4 == 1) {
      CVar3 = '\r';
    }
    if ((int)uVar4 != 0) {
      return CVar3;
    }
  }
  return '\0';
}

Assistant:

CHAR CNNModelPredictBinary0DQ(CharCNNClassifier *model, IplImage *pImage) {
    int row, col, i, j, k;
    INT8U output_row, output_col;
    int map_index_position, image_index_position;
    int sum, max, value;
    int c11_output[model->model_binary_0DQ.C11.outChannels * 13 * 13];
//    int c21_output[25 * 11 * 11], c31_output[25 * 9 * 9];
    int merge_output[model->model_binary_0DQ.FC1.inputNum];
    int fc1_output[model->model_binary_0DQ.FC1.outputNum];
// convolution - layer
//    3*3
//    15-3+1=13
    output_row = 13;
    output_col = 13;
    for (k = 0; k < model->model_binary_0DQ.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                sum = 0;
                for (row = 0; row < model->model_binary_0DQ.C11.height; row++) {
                    for (col = 0; col < model->model_binary_0DQ.C11.widthStep; col++) {
                        //      index position
                        map_index_position = k * 3 * 3 + row * model->model_binary_0DQ.C11.widthStep + col;
                        image_index_position = (i + row) * pImage->widthStep + (j + col);
//                        printf("%d,%d\n", map_index_position, image_index_position);
//                        printf("%ld,%d,%ld\n", C11_Map_Weight[map_index_position],
//                               pImage->imageData[image_index_position],
//                               C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position]);
                        sum += Binary0DQ_C11_Map_Weight[map_index_position] * pImage->imageData[image_index_position];
                    }
                }
                c11_output[k * output_row * output_row + i * output_row + j] = TanhApproximateFunction(
                        sum + Binary0DQ_C11_B_Weight[k]);
//                printf("%ld\n",sum + C11_B_Weight[k]);
            }
        }
//        printmat2(c11_output, 13, 13);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }


    output_row = 6;
    output_col = 6;
    for (k = 0; k < model->model_binary_0DQ.C11.outChannels; k++) {
//        for each filters
        for (i = 0; i < output_row; i++) {
            //        i represents start point in row
            for (j = 0; j < output_col; j++) {
                //        j represents start point in col
                max = -10;
                for (row = 0; row < 2; row++) {
                    for (col = 0; col < 2; col++) {
                        value = c11_output[k * 13 * 13 + (2 * i + row) * 13 + (2 * j + col)];
                        if (value > max) {
                            max = value;
                        }

                    }
                }
                merge_output[k * 6 * 6 + i * 6 + j] = max;
            }
        }
//        printmat2(merge_output, 6, 6);
//                printf("%f",sum);
//                printf("%f",c11_output[k * 13 * 13 + i * 13 + j]);
//        assert(NULL);
    }
    //endregion


    //region FC1 - 360*40

    for (row = 0; row < model->model_binary_0DQ.FC1.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_0DQ.FC1.inputNum; col++) {
            sum += merge_output[col] * Binary0DQ_FC1_Map_Weight[row * model->model_binary_0DQ.FC1.inputNum + col];
        }
//        fc1_output[row] = tanhf(sum + FC1_B_Weight[row]);
        fc1_output[row] = TanhApproximateFunction(sum + Binary0DQ_FC1_B_Weight[row]);
//        fc1_output[row] = sum + FC1_B_Weight[row];
    }
    //endregion

//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",fc1_output[col]);
//    }
//    printf("\n");
//
//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[7*model->model_binary_0DQ.FC2.inputNum+col]);
//    }
//    printf("\n");
//    for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//        printf("%f,",FC2_Map_Weight[33*model->model_binary_0DQ.FC2.inputNum+col]);
//    }
//    printf("\n");
    //region FC2 - 40*34
    max = -10000;
    k = 0;

    for (row = 0; row < model->model_binary_0DQ.FC2.outputNum; row++) {
        sum = 0;
        for (col = 0; col < model->model_binary_0DQ.FC2.inputNum; col++) {
//            printf("%d,%d\n",fc1_output[col],FC2_Map_Weight[row * model->model_binary_0DQ.FC2.inputNum + col]);
            sum += fc1_output[col] * Binary0DQ_FC2_Map_Weight[row * model->model_binary_0DQ.FC2.inputNum + col];
        }
        value = sum + Binary0DQ_FC2_B_Weight[row];
//        printf("%ld\n",value);
        if (value > max) {
            max = value;
            k = row;
        }
    }
    //endregion

//    printf("%f,%d\n",max,k);
    if (k == 0)
        return 0;
    else if (k == 1)
        return 13;
    else
        return 25;
//    return '1' ;
}